

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

char * crnlib::strcpy_safe(char *pDst,size_t dst_len,char *pSrc)

{
  char cVar1;
  char c;
  char *q;
  char *pSrc_local;
  size_t dst_len_local;
  char *pDst_local;
  
  q = pDst;
  pSrc_local = pSrc;
  dst_len_local = dst_len;
  if (dst_len != 0) {
    do {
      if (dst_len_local == 1) {
        *q = '\0';
        return pDst;
      }
      cVar1 = *pSrc_local;
      *q = cVar1;
      dst_len_local = dst_len_local - 1;
      q = q + 1;
      pSrc_local = pSrc_local + 1;
    } while (cVar1 != '\0');
  }
  return pDst;
}

Assistant:

char* strcpy_safe(char* pDst, size_t dst_len, const char* pSrc) {
  CRNLIB_ASSERT(pDst && pSrc && dst_len);
  if (!dst_len)
    return pDst;

  char* q = pDst;
  char c;

  do {
    if (dst_len == 1) {
      *q++ = '\0';
      break;
    }

    c = *pSrc++;
    *q++ = c;

    dst_len--;

  } while (c);

  CRNLIB_ASSERT((q - pDst) <= (int)dst_len);

  return pDst;
}